

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Nblock(int g_a,int *nblock)

{
  long lVar1;
  Integer *pIVar2;
  Integer _ga_work [7];
  Integer local_58 [8];
  
  pIVar2 = local_58;
  pnga_nblock((long)g_a,local_58);
  lVar1 = pnga_get_dimension((long)g_a);
  if (0 < lVar1) {
    do {
      nblock[lVar1 + -1] = *(int *)pIVar2;
      pIVar2 = (Integer *)((long)pIVar2 + 8);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void NGA_Nblock(int g_a, int *nblock)
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    wnga_nblock(aa, _ga_work);
    ndim = wnga_get_dimension(aa);
    COPYF2C(_ga_work,nblock,ndim);
}